

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# supercell.cpp
# Opt level: O0

void CIF::makeSuperCell(Reader *cif,Vector3d *uvw,Vector3d *abc,Vector3d *widths,Vector3d *tilts,
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *A,vector<double,_std::allocator<double>_> *x,
                       vector<double,_std::allocator<double>_> *y,
                       vector<double,_std::allocator<double>_> *z,
                       vector<double,_std::allocator<double>_> *occ,
                       vector<double,_std::allocator<double>_> *ux,
                       vector<double,_std::allocator<double>_> *uy,
                       vector<double,_std::allocator<double>_> *uz)

{
  pointer *__return_storage_ptr__;
  allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *this;
  double dVar1;
  double dVar2;
  value_type vVar3;
  Scalar SVar4;
  int iVar5;
  CoeffReturnType CVar6;
  initializer_list<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> __l;
  undefined4 uVar7;
  Scalar SVar8;
  bool bVar9;
  int iVar10;
  Scalar *pSVar11;
  runtime_error *prVar12;
  ulong uVar13;
  size_type sVar14;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pMVar15;
  Matrix<double,3,1,0,3,1> *pMVar16;
  size_type sVar17;
  Scalar *pSVar18;
  reference pAVar19;
  reference __x;
  reference pvVar20;
  StorageBaseType *pSVar21;
  MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *pMVar22;
  reference pvVar23;
  reference this_00;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar24;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar25;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_11d8;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_11c0;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_11a8;
  vector<double,_std::allocator<double>_> local_1190;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1178;
  Vector3d local_1160;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1148;
  int local_112c;
  undefined1 local_1128 [4];
  int ind;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  local_1060;
  undefined1 local_f68 [8];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  new_pos;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  i_factor;
  undefined1 local_e18 [4];
  int i_1;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  j_factor;
  undefined1 local_df0 [4];
  int j;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  k_factor;
  undefined1 local_dc8 [4];
  int k;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_da0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_d78;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_d50;
  undefined1 local_cf0 [8];
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  p;
  vector<double,_std::allocator<double>_> pos;
  iterator __end2;
  iterator __begin2;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range2;
  AtomSite at_1;
  __normal_iterator<CIF::AtomSite_*,_std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>_>
  local_b90;
  iterator __end1_1;
  iterator __begin1_1;
  vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *__range1_1;
  int it;
  CmpEQReturnType local_b50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_b38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b20;
  undefined1 local_b08 [8];
  AtomSite at;
  iterator __end1;
  iterator __begin1;
  vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *__range1;
  undefined1 local_a58 [4];
  int count;
  Matrix<int,3,1,0,3,1> local_a3c [8];
  Vector3i range;
  Vector3i maxs;
  Vector3i mins;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_a08;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_9f8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_9e8;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_9d8;
  int local_9c4;
  Scalar SStack_9c0;
  int i;
  Scalar local_9b8;
  Scalar local_9b0;
  Matrix<double,_3,_1,_0,_3,_1> local_9a8;
  undefined1 local_990 [8];
  Matrix3d z_rotation;
  Scalar local_940;
  Scalar local_938;
  Matrix<double,_3,_1,_0,_3,_1> local_930;
  undefined1 local_918 [8];
  Matrix3d y_rotation;
  Scalar local_8c8;
  Scalar local_8c0;
  Matrix<double,_3,_1,_0,_3,_1> local_8b8;
  undefined1 local_8a0 [8];
  Matrix3d x_rotation;
  double gamma;
  double beta;
  double alpha;
  IsNaNReturnType local_838;
  Matrix<double,_3,_1,_0,_3,_1> local_828;
  Matrix<double,_3,_1,_0,_3,_1> local_810;
  Matrix3d local_7f8;
  Matrix<double,_3,_1,_0,_3,_1> local_7b0;
  Matrix3d local_798;
  double local_750;
  PlainObject local_748;
  int local_72c;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_728;
  Scalar local_700;
  Scalar local_6f8;
  Scalar local_6f0;
  undefined1 local_6e8 [8];
  Vector3d x_direction;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_6c0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_698;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_670;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_648;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_5e8;
  undefined1 local_550 [8];
  Vector3d abc_vec;
  NestedExpressionType local_530;
  CmpNEQReturnType local_528;
  EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_503 [3];
  undefined1 local_500 [8];
  Matrix3d xy_rotation;
  IsNaNReturnType local_4b0;
  Matrix<double,_3,_1,_0,_3,_1> local_4a0;
  Matrix<double,_3,_1,_0,_3,_1> local_488;
  undefined1 local_470 [8];
  Matrix3d za_rotation;
  Scalar local_420;
  Scalar local_418;
  undefined1 local_410 [8];
  Vector3d z_direction;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_3d0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_3a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_380;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_320;
  undefined1 local_288 [8];
  Vector3d uvw_vec;
  Matrix<double,_3,_1,_0,_3,_1> local_268;
  Matrix<double,_3,_1,_0,_3,_1> local_250;
  Matrix<double,_3,_1,_0,_3,_1> local_238;
  iterator local_220;
  size_type local_218;
  undefined1 local_210 [8];
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  basis;
  double *local_1e0;
  undefined1 local_1d8 [8];
  Vector3d c_vector;
  double *local_1a8;
  undefined1 local_1a0 [8];
  Vector3d b_vector;
  double *local_170;
  undefined1 local_168 [8];
  Vector3d a_vector;
  undefined1 local_140 [8];
  CellGeometry geom;
  UnitCell cell;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *A_local;
  Vector3d *tilts_local;
  Vector3d *widths_local;
  Vector3d *abc_local;
  Vector3d *uvw_local;
  Reader *cif_local;
  
  __return_storage_ptr__ =
       &geom.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage;
  Reader::getUnitCell((UnitCell *)__return_storage_ptr__,cif);
  UnitCell::getCellGeometry((CellGeometry *)local_140,(UnitCell *)__return_storage_ptr__);
  CellGeometry::getAVector
            ((vector<double,_std::allocator<double>_> *)
             (b_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2),(CellGeometry *)local_140);
  local_170 = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)
                         (b_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 2));
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<double*>((Matrix<double,3,1,0,3,1> *)local_168,&local_170)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             (b_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2));
  CellGeometry::getBVector
            ((vector<double,_std::allocator<double>_> *)
             (c_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2),(CellGeometry *)local_140);
  local_1a8 = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)
                         (c_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 2));
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<double*>((Matrix<double,3,1,0,3,1> *)local_1a0,&local_1a8)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             (c_vector.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2));
  CellGeometry::getCVector
            ((vector<double,_std::allocator<double>_> *)
             &basis.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(CellGeometry *)local_140);
  local_1e0 = std::vector<double,_std::allocator<double>_>::data
                        ((vector<double,_std::allocator<double>_> *)
                         &basis.
                          super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,3,1,0,3,1>::Matrix<double*>((Matrix<double,3,1,0,3,1> *)local_1d8,&local_1e0)
  ;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &basis.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_268,(Matrix<double,_3,_1,_0,_3,_1> *)local_168);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_250,(Matrix<double,_3,_1,_0,_3,_1> *)local_1a0);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_238,(Matrix<double,_3,_1,_0,_3,_1> *)local_1d8);
  local_220 = &local_268;
  local_218 = 3;
  this = (allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
         ((long)uvw_vec.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 0x17);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::allocator(this);
  __l._M_len = local_218;
  __l._M_array = local_220;
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)local_210,__l,this);
  std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~allocator
            ((allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             ((long)uvw_vec.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array + 0x17));
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)uvw,0);
  Eigen::operator*(&local_3a8,pSVar11,(StorageBaseType *)local_168);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)uvw,1);
  Eigen::operator*(&local_3d0,pSVar11,(StorageBaseType *)local_1a0);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
  ::operator+(&local_380,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
               *)&local_3a8,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&local_3d0);
  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                      ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)uvw,2);
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                    *)(z_direction.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                       m_storage.m_data.array + 2),pSVar11,(StorageBaseType *)local_1d8);
  Eigen::
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
  ::operator+(&local_320,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
               *)&local_380,
              (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)(z_direction.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage
                  .m_data.array + 2));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
            ((Matrix<double,3,1,0,3,1> *)local_288,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
              *)&local_320);
  local_418 = 0.0;
  local_420 = 0.0;
  za_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = 1.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_410,&local_418,&local_420,
             za_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
             m_data.array + 8);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_488,(Matrix<double,_3,_1,_0,_3,_1> *)local_288);
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            (&local_4a0,(Matrix<double,_3,_1,_0,_3,_1> *)local_410);
  Utilities::generateNormalisedRotationMatrix<double>((Matrix3d *)local_470,&local_488,&local_4a0);
  xy_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[8]
       = (double)Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::array
                           ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_470);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::isNaN
            (&local_4b0,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)
             (xy_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
              m_data.array + 8));
  SVar8 = Eigen::
          DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_isnan_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
          ::sum((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_isnan_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                 *)&local_4b0);
  if (SVar8) {
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"Zone axis rotation matrix contains NaNs");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
  Eigen::Matrix<double,3,3,0,3,3>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,3,3,0,3,3>>>
            ((Matrix<double,3,3,0,3,3> *)local_500,local_503);
  local_530 = (NestedExpressionType)
              Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::array
                        ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)abc);
  abc_vec.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       0.0;
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>::operator!=
            (&local_528,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_> *)&local_530,
             abc_vec.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
             array + 2);
  bVar9 = Eigen::
          DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)4>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_3,_1,_0,_3,_1>_>_>_>
          ::any((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<double,_double,_(Eigen::internal::ComparisonName)4>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Array<double,_3,_1,_0,_3,_1>_>_>_>
                 *)&local_528);
  if (bVar9) {
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)abc,0);
    Eigen::operator*(&local_670,pSVar11,(StorageBaseType *)local_168);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)abc,1);
    Eigen::operator*(&local_698,pSVar11,(StorageBaseType *)local_1a0);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
    ::operator+(&local_648,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                 *)&local_670,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&local_698);
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)abc,2);
    Eigen::operator*(&local_6c0,pSVar11,(StorageBaseType *)local_1d8);
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
    ::operator+(&local_5e8,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                 *)&local_648,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 *)&local_6c0);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,3,1,0,3,1> *)local_550,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_5e8);
    PVar25 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                       ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_470,
                        (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_550);
    x_direction.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
    [2] = (double)PVar25.m_lhs;
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)local_550,
               (DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                *)(x_direction.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                   m_storage.m_data.array + 2));
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_550,2);
    *pSVar11 = 0.0;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_550,0);
    if (ABS(*pSVar11) < 1e-15) {
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_550,0);
      *pSVar11 = 0.0;
    }
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_550,1);
    if (ABS(*pSVar11) < 1e-15) {
      pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                          ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)local_550,1);
      *pSVar11 = 0.0;
    }
    local_6f0 = 1.0;
    local_6f8 = 0.0;
    local_700 = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_6e8,&local_6f0,&local_6f8,&local_700);
    local_72c = -1;
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalized
              (&local_748,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_550);
    Eigen::operator*(&local_728,&local_72c,(StorageBaseType *)&local_748);
    local_750 = Eigen::NumTraits<double>::dummy_precision();
    bVar9 = Eigen::DenseBase<Eigen::Matrix<double,3,1,0,3,1>>::
            isApprox<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                      ((DenseBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_6e8,
                       (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)&local_728,&local_750);
    if (bVar9) {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (&local_7b0,(Matrix<double,_3,_1,_0,_3,_1> *)local_410);
      Utilities::generateRotationMatrix<double>(&local_798,&local_7b0,3.141592653589793);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)local_500,&local_798);
    }
    else {
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (&local_810,(Matrix<double,_3,_1,_0,_3,_1> *)local_6e8);
      Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
                (&local_828,(Matrix<double,_3,_1,_0,_3,_1> *)local_550);
      Utilities::generateNormalisedRotationMatrix<double>(&local_7f8,&local_810,&local_828);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)local_500,&local_7f8);
    }
  }
  alpha = (double)Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::array
                            ((MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)local_500);
  Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>::isNaN
            (&local_838,
             (ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_> *)&alpha);
  SVar8 = Eigen::
          DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_isnan_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
          ::sum((DenseBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_isnan_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>_>
                 *)&local_838);
  if (!SVar8) {
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)tilts,0);
    dVar1 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)tilts,1);
    dVar2 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)tilts,2);
    x_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = (*pSVar11 * 3.141592653589793) / 180.0;
    local_8c0 = 1.0;
    local_8c8 = 0.0;
    y_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_8b8,&local_8c0,&local_8c8,
               y_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + 8);
    Utilities::generateRotationMatrix<double>
              ((Matrix3d *)local_8a0,&local_8b8,(dVar1 * 3.141592653589793) / 180.0);
    local_938 = 0.0;
    local_940 = 1.0;
    z_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
    [8] = 0.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_930,&local_938,&local_940,
               z_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array + 8);
    Utilities::generateRotationMatrix<double>
              ((Matrix3d *)local_918,&local_930,(dVar2 * 3.141592653589793) / 180.0);
    local_9b0 = 0.0;
    local_9b8 = 0.0;
    SStack_9c0 = 1.0;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              (&local_9a8,&local_9b0,&local_9b8,&stack0xfffffffffffff640);
    Utilities::generateRotationMatrix<double>
              ((Matrix3d *)local_990,&local_9a8,
               x_rotation.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
               m_data.array[8]);
    local_9c4 = 0;
    while( true ) {
      uVar13 = (ulong)local_9c4;
      sVar14 = std::
               vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               ::size((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                       *)local_210);
      if (sVar14 <= uVar13) break;
      pMVar15 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      PVar25 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_470,pMVar15);
      local_9d8 = PVar25;
      pMVar16 = (Matrix<double,3,1,0,3,1> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (pMVar16,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                          *)&local_9d8);
      pMVar15 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      PVar25 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_500,pMVar15);
      local_9e8 = PVar25;
      pMVar16 = (Matrix<double,3,1,0,3,1> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (pMVar16,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                          *)&local_9e8);
      pMVar15 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      PVar25 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_8a0,pMVar15);
      local_9f8 = PVar25;
      pMVar16 = (Matrix<double,3,1,0,3,1> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (pMVar16,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                          *)&local_9f8);
      pMVar15 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      PVar25 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_918,pMVar15);
      local_a08 = PVar25;
      pMVar16 = (Matrix<double,3,1,0,3,1> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (pMVar16,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                          *)&local_a08);
      pMVar15 = (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      PVar25 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                         ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)local_990,pMVar15);
      mins.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array._4_8_ =
           PVar25.m_lhs;
      pMVar16 = (Matrix<double,3,1,0,3,1> *)
                std::
                vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                              *)local_210,(long)local_9c4);
      Eigen::Matrix<double,3,1,0,3,1>::operator=
                (pMVar16,(DenseBase<Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>_>
                          *)(mins.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                             m_storage.m_data.array + 1));
      local_9c4 = local_9c4 + 1;
    }
    Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<int,_3,_1,_0,_3,_1> *)
               (maxs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::Matrix<int,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<int,_3,_1,_0,_3,_1> *)
               (range.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)widths,0);
    dVar1 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)widths,1);
    dVar2 = *pSVar11;
    pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)widths,2);
    calculateTiling((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)local_210,dVar1,dVar2,*pSVar11,
                    (Vector3i *)
                    (maxs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data
                     .array + 1),
                    (Vector3i *)
                    (range.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                     m_data.array + 1));
    Eigen::MatrixBase<Eigen::Matrix<int,3,1,0,3,1>>::operator-
              ((CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,_int>,_const_Eigen::Matrix<int,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_>
                *)local_a58,
               (MatrixBase<Eigen::Matrix<int,3,1,0,3,1>> *)
               (range.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1),
               (MatrixBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)
               (maxs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 1));
    Eigen::Matrix<int,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,int>,Eigen::Matrix<int,3,1,0,3,1>const,Eigen::Matrix<int,3,1,0,3,1>const>>
              (local_a3c,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<int,_int>,_const_Eigen::Matrix<int,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>
                *)local_a58);
    __range1._4_4_ = 0;
    UnitCell::getAtoms((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1,
                       (UnitCell *)
                       &geom.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    __end1 = std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::begin
                       ((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1);
    at.label.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::end
                            ((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1);
    while( true ) {
      bVar9 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<CIF::AtomSite_*,_std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>_>
                                  *)&at.label.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar9) break;
      pAVar19 = __gnu_cxx::
                __normal_iterator<CIF::AtomSite_*,_std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>_>
                ::operator*(&__end1);
      AtomSite::AtomSite((AtomSite *)local_b08,pAVar19);
      AtomSite::getElements_abi_cxx11_(&local_b20,(AtomSite *)local_b08);
      sVar14 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(&local_b20);
      AtomSite::getPositions(&local_b38,(AtomSite *)local_b08);
      sVar17 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::size(&local_b38);
      __range1._4_4_ = __range1._4_4_ + (int)sVar14 * (int)sVar17;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector(&local_b38);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_b20);
      AtomSite::~AtomSite((AtomSite *)local_b08);
      __gnu_cxx::
      __normal_iterator<CIF::AtomSite_*,_std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>_>
      ::operator++(&__end1);
    }
    std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector
              ((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1);
    pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)local_a3c,0);
    iVar10 = *pSVar18;
    pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)local_a3c,1);
    iVar5 = *pSVar18;
    pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                        ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)local_a3c,2);
    iVar10 = __range1._4_4_ * iVar10 * iVar5 * *pSVar18;
    _it = Eigen::MatrixBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::array
                    ((MatrixBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_a3c);
    __range1_1._4_4_ = 0;
    Eigen::ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_>::operator==
              (&local_b50,(ArrayBase<Eigen::ArrayWrapper<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>_> *)&it
               ,(Scalar *)((long)&__range1_1 + 4));
    bVar9 = Eigen::
            DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<int,_int,_(Eigen::internal::ComparisonName)0>,_const_Eigen::ArrayWrapper<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Array<int,_3,_1,_0,_3,_1>_>_>_>
            ::any((DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_cmp_op<int,_int,_(Eigen::internal::ComparisonName)0>,_const_Eigen::ArrayWrapper<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<int>,_Eigen::Array<int,_3,_1,_0,_3,_1>_>_>_>
                   *)&local_b50);
    if (bVar9) {
      prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar12,"Did not find any atoms inside limits");
      __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(A,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(x,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(y,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(z,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(occ,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(ux,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(uy,(long)iVar10);
    std::vector<double,_std::allocator<double>_>::resize(uz,(long)iVar10);
    __range1_1._0_4_ = 0;
    UnitCell::getAtoms((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1_1,
                       (UnitCell *)
                       &geom.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    __end1_1 = std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::begin
                         ((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1_1);
    local_b90._M_current =
         (AtomSite *)
         std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::end
                   ((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1_1);
    while( true ) {
      bVar9 = __gnu_cxx::operator!=(&__end1_1,&local_b90);
      if (!bVar9) break;
      pAVar19 = __gnu_cxx::
                __normal_iterator<CIF::AtomSite_*,_std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>_>
                ::operator*(&__end1_1);
      AtomSite::AtomSite((AtomSite *)&__range2,pAVar19);
      AtomSite::getPositions
                ((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  *)&__begin2,(AtomSite *)&__range2);
      __end2 = std::
               vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ::begin((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                        *)&__begin2);
      pos.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)std::
                    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                    ::end((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)&__begin2);
      while( true ) {
        bVar9 = __gnu_cxx::operator!=
                          (&__end2,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                    *)&pos.super__Vector_base<double,_std::allocator<double>_>.
                                       _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (!bVar9) break;
        __x = __gnu_cxx::
              __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
              ::operator*(&__end2);
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)&p.field_0x90,__x);
        pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&p.field_0x90,0);
        pSVar21 = (StorageBaseType *)
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                *)local_210,0);
        Eigen::operator*(&local_d78,pvVar20,pSVar21);
        pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&p.field_0x90,1);
        pSVar21 = (StorageBaseType *)
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                *)local_210,1);
        Eigen::operator*(&local_da0,pvVar20,pSVar21);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
        ::operator+(&local_d50,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>>
                     *)&local_d78,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)&local_da0);
        pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                            ((vector<double,_std::allocator<double>_> *)&p.field_0x90,2);
        pSVar21 = (StorageBaseType *)
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                *)local_210,2);
        Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
                          *)local_dc8,pvVar20,pSVar21);
        Eigen::
        MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
        ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)local_cf0,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                     *)&local_d50,
                    (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)local_dc8);
        pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                            ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                             (maxs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                              m_storage.m_data.array + 1),2);
        k_factor._28_4_ = *pSVar18;
        while( true ) {
          uVar7 = k_factor._28_4_;
          pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                               (range.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array + 1),2);
          if (*pSVar18 <= (int)uVar7) break;
          pMVar22 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                    std::
                    vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                    ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                  *)local_210,2);
          Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                    ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      *)local_df0,pMVar22,(int *)&k_factor.field_0x1c);
          pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                              ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                               (maxs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                m_storage.m_data.array + 1),1);
          j_factor._28_4_ = *pSVar18;
          while( true ) {
            uVar7 = j_factor._28_4_;
            pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                                 (range.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array + 1),1);
            if (*pSVar18 <= (int)uVar7) break;
            pMVar22 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                      std::
                      vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                      ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                    *)local_210,1);
            Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                      ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        *)local_e18,pMVar22,(int *)&j_factor.field_0x1c);
            pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                                ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                                 (maxs.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                  m_storage.m_data.array + 1),0);
            i_factor._28_4_ = *pSVar18;
            while( true ) {
              uVar7 = i_factor._28_4_;
              pSVar18 = Eigen::DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1>::operator()
                                  ((DenseCoeffsBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>,_1> *)
                                   (range.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                                    m_storage.m_data.array + 1),0);
              if (*pSVar18 <= (int)uVar7) break;
              pMVar22 = (MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
                        std::
                        vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                        ::operator[]((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                                      *)local_210,0);
              Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
                        ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                          *)&new_pos.field_0x120,pMVar22,(int *)&i_factor.field_0x1c);
              Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                           *)local_1128,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                           *)local_cf0,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                           *)&new_pos.field_0x120);
              Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
              ::operator+(&local_1060,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                           *)local_1128,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                           *)local_e18);
              Eigen::
              MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
              ::operator+((CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                           *)local_f68,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                           *)&local_1060,
                          (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                           *)local_df0);
              local_112c = 0;
              while( true ) {
                uVar13 = (ulong)local_112c;
                AtomSite::getElements_abi_cxx11_(&local_1148,(AtomSite *)&__range2);
                sVar14 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(&local_1148);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_1148);
                if (sVar14 <= uVar13) break;
                Eigen::Matrix<double,3,1,0,3,1>::
                Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const,Eigen::Matrix<double,3,1,0,3,1>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>const>>
                          ((Matrix<double,3,1,0,3,1> *)&local_1160,
                           (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>_>
                            *)local_f68);
                pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                     widths,0);
                dVar1 = *pSVar11;
                pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                     widths,1);
                dVar2 = *pSVar11;
                pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::
                          operator()((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                                     widths,2);
                bVar9 = testInRange(&local_1160,0.0,dVar1,0.0,dVar2,0.0,*pSVar11);
                if (bVar9) {
                  AtomSite::getElements_abi_cxx11_(&local_1178,(AtomSite *)&__range2);
                  pvVar23 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](&local_1178,(long)local_112c);
                  this_00 = std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::operator[](A,(long)(int)__range1_1);
                  std::__cxx11::string::operator=((string *)this_00,(string *)pvVar23);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_1178);
                  CVar6 = Eigen::
                          DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_0>
                          ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_0>
                                        *)local_f68,0);
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (x,(long)(int)__range1_1);
                  *pvVar20 = CVar6;
                  CVar6 = Eigen::
                          DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_0>
                          ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_0>
                                        *)local_f68,1);
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (y,(long)(int)__range1_1);
                  *pvVar20 = CVar6;
                  CVar6 = Eigen::
                          DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_0>
                          ::operator()((DenseCoeffsBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>,_0>
                                        *)local_f68,2);
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (z,(long)(int)__range1_1);
                  *pvVar20 = CVar6;
                  AtomSite::getOccupancies(&local_1190,(AtomSite *)&__range2);
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (&local_1190,(long)local_112c);
                  vVar3 = *pvVar20;
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (occ,(long)(int)__range1_1);
                  *pvVar20 = vVar3;
                  std::vector<double,_std::allocator<double>_>::~vector(&local_1190);
                  AtomSite::getThermals(&local_11a8,(AtomSite *)&__range2);
                  pDVar24 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::operator[](&local_11a8,(long)local_112c);
                  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::
                            operator()(pDVar24,0);
                  SVar4 = *pSVar11;
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (ux,(long)(int)__range1_1);
                  *pvVar20 = SVar4;
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::~vector(&local_11a8);
                  AtomSite::getThermals(&local_11c0,(AtomSite *)&__range2);
                  pDVar24 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::operator[](&local_11c0,(long)local_112c);
                  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::
                            operator()(pDVar24,1);
                  SVar4 = *pSVar11;
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (uy,(long)(int)__range1_1);
                  *pvVar20 = SVar4;
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::~vector(&local_11c0);
                  AtomSite::getThermals(&local_11d8,(AtomSite *)&__range2);
                  pDVar24 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                            std::
                            vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                            ::operator[](&local_11d8,(long)local_112c);
                  pSVar11 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::
                            operator()(pDVar24,2);
                  SVar4 = *pSVar11;
                  pvVar20 = std::vector<double,_std::allocator<double>_>::operator[]
                                      (uz,(long)(int)__range1_1);
                  *pvVar20 = SVar4;
                  std::
                  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  ::~vector(&local_11d8);
                  __range1_1._0_4_ = (int)__range1_1 + 1;
                }
                local_112c = local_112c + 1;
              }
              i_factor._28_4_ = i_factor._28_4_ + 1;
            }
            j_factor._28_4_ = j_factor._28_4_ + 1;
          }
          k_factor._28_4_ = k_factor._28_4_ + 1;
        }
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)&p.field_0x90);
        __gnu_cxx::
        __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
        ::operator++(&__end2);
      }
      at_1.label.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 9;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)&__begin2);
      AtomSite::~AtomSite((AtomSite *)&__range2);
      __gnu_cxx::
      __normal_iterator<CIF::AtomSite_*,_std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>_>
      ::operator++(&__end1_1);
    }
    at_1.label.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 7;
    std::vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_>::~vector
              ((vector<CIF::AtomSite,_std::allocator<CIF::AtomSite>_> *)&__begin1_1);
    bVar9 = std::vector<double,_std::allocator<double>_>::empty(x);
    if (!bVar9) {
      bVar9 = std::vector<double,_std::allocator<double>_>::empty(y);
      if (!bVar9) {
        bVar9 = std::vector<double,_std::allocator<double>_>::empty(z);
        if (!bVar9) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::resize(A,(long)(int)__range1_1);
          std::vector<double,_std::allocator<double>_>::resize(x,(long)(int)__range1_1);
          std::vector<double,_std::allocator<double>_>::resize(y,(long)(int)__range1_1);
          std::vector<double,_std::allocator<double>_>::resize(z,(long)(int)__range1_1);
          std::vector<double,_std::allocator<double>_>::resize(occ,(long)(int)__range1_1);
          std::vector<double,_std::allocator<double>_>::resize(ux,(long)(int)__range1_1);
          std::vector<double,_std::allocator<double>_>::resize(uy,(long)(int)__range1_1);
          std::vector<double,_std::allocator<double>_>::resize(uz,(long)(int)__range1_1);
          std::
          vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
          ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     *)local_210);
          CellGeometry::~CellGeometry((CellGeometry *)local_140);
          UnitCell::~UnitCell((UnitCell *)
                              &geom.cvec.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_end_of_storage);
          return;
        }
      }
    }
    prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar12,"Did not find any atoms inside limits");
    __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  prVar12 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar12,"Normal rotation matrix contains NaNs");
  __cxa_throw(prVar12,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void makeSuperCell(Reader cif, Eigen::Vector3d uvw, Eigen::Vector3d abc, Eigen::Vector3d widths,
                       Eigen::Vector3d tilts, std::vector<std::string> &A, std::vector<double> &x, std::vector<double> &y,
                       std::vector<double> &z, std::vector<double> &occ, std::vector<double> &ux, std::vector<double> &uy,
                       std::vector<double> &uz) {
        // TODO: check that the uvw and abc vectors are no colinear
        UnitCell cell = cif.getUnitCell();

        auto geom = cell.getCellGeometry();
        auto a_vector = Eigen::Vector3d(geom.getAVector().data());
        auto b_vector = Eigen::Vector3d(geom.getBVector().data());
        auto c_vector = Eigen::Vector3d(geom.getCVector().data());

        // TODO: try to use more eigen matrices/vectors instead of stl
//    Eigen::Matrix3d basis;
//    basis << // use std::Vectors here?

        // for easy loopage
        // TODO: make this an eigen vector of eigen vectors
        std::vector<Eigen::Vector3d> basis = {a_vector, b_vector, c_vector};

        // this gives us the element type, occupancy and FRACTIONAL coords as well as the basis vectors
        // now we just need rotate them and tile them to fill the space

        // create vector from the zone axis we want
        Eigen::Vector3d uvw_vec = uvw(0) * a_vector + uvw(1) * b_vector + uvw(2) * c_vector;
        // create matrix with direction we want to map onto (here is is the z direction)
        Eigen::Vector3d z_direction(0.0, 0.0, 1.0);
        // create the rotation matrix
        auto za_rotation = Utilities::generateNormalisedRotationMatrix<double>(uvw_vec, z_direction);

        if (za_rotation.array().isNaN().sum() != 0) {
            throw std::runtime_error("Zone axis rotation matrix contains NaNs");
        }

        // similarly for rotation in x,y plane, though here we default to 0 rotation
        Eigen::Matrix3d xy_rotation = Eigen::Matrix3d::Identity();
        if ((abc.array() != 0).any()) {
            Eigen::Vector3d abc_vec = abc(0) * a_vector + abc(1) * b_vector + abc(2) * c_vector;
            abc_vec = za_rotation * abc_vec;
            abc_vec(2) = 0.0; // no rotate the z-axis!
            if (std::fabs(abc_vec(0)) < 1e-15)
                abc_vec(0) = 0.0;
            if (std::fabs(abc_vec(1)) < 1e-15)
                abc_vec(1) = 0.0;
            Eigen::Vector3d x_direction(1.0, 0.0, 0.0); // TODO: use << initialisation
            // Need the negative angle here? so give inputs in opposite order?
            if (x_direction.isApprox(-1 * abc_vec.normalized())) // note normalized() return a copy (that is normalized...)
                // Vectors are opposite, generate 180 rotation about z
                xy_rotation = Utilities::generateRotationMatrix<double>(z_direction, CIF::Utilities::pi);
            else
                // Generate rotation (returns correctly if vectors are in the same direction)
                xy_rotation = Utilities::generateNormalisedRotationMatrix<double>(x_direction, abc_vec);
        }

        if (xy_rotation.array().isNaN().sum() != 0) {
            throw std::runtime_error("Normal rotation matrix contains NaNs");
        }

        // convert angles to radians
        double alpha = tilts(0) * CIF::Utilities::pi / 180;
        double beta = tilts(1) * CIF::Utilities::pi / 180;
        double gamma = tilts(2) * CIF::Utilities::pi / 180;

        // generate the small rotation matrices
        auto x_rotation = Utilities::generateRotationMatrix<double>({1.0, 0.0, 0.0}, alpha);
        auto y_rotation = Utilities::generateRotationMatrix<double>({0.0, 1.0, 0.0}, beta);
        auto z_rotation = Utilities::generateRotationMatrix<double>({0.0, 0.0, 1.0}, gamma);

        for (int i = 0; i < basis.size(); ++i) {
            basis[i] = za_rotation * basis[i];
            basis[i] = xy_rotation * basis[i];
            basis[i] = x_rotation * basis[i];
            basis[i] = y_rotation * basis[i];
            basis[i] = z_rotation * basis[i];
        }

        Eigen::Vector3i mins, maxs;
        calculateTiling(basis, widths(0), widths(1), widths(2), mins, maxs);
        Eigen::Vector3i range = maxs - mins;

        // get total number of atoms in our xyz file
        int count = 0;
        for (auto at : cell.getAtoms())
            count += at.getElements().size() * at.getPositions().size();
        count = count * range(0) * range(1) * range(2);

        if ((range.array() == 0).any())
            throw std::runtime_error("Did not find any atoms inside limits");

        A.resize(count);
        x.resize(count);
        y.resize(count);
        z.resize(count);
        occ.resize(count);
        ux.resize(count);
        uy.resize(count);
        uz.resize(count);

        int it = 0;

        for (auto at : cell.getAtoms()) {
            for (auto pos : at.getPositions()) {
                // convert from fractional coordinates
                auto p = pos[0] * basis[0] + pos[1] * basis[1] + pos[2] * basis[2];

                for (int k = mins(2); k < maxs(2); ++k) {
                    auto k_factor = basis[2] * k;

                    for (int j = mins(1); j < maxs(1); ++j) {
                        auto j_factor = basis[1] * j;

                        for (int i = mins(0); i < maxs(0); ++i) {
                            auto i_factor = basis[0] * i;

                            auto new_pos = p + i_factor + j_factor + k_factor;

                            for (int ind = 0; ind < at.getElements().size(); ++ind) {

                                if (testInRange(new_pos, 0.0, widths(0), 0.0, widths(1), 0.0, widths(2))) {
                                    A[it] = at.getElements()[ind];
                                    x[it] = new_pos(0);
                                    y[it] = new_pos(1);
                                    z[it] = new_pos(2);
                                    occ[it] = at.getOccupancies()[ind];
                                    ux[it] = at.getThermals()[ind](0);
                                    uy[it] = at.getThermals()[ind](1);
                                    uz[it] = at.getThermals()[ind](2);

                                    ++it;
                                }
                            }
                        }
                    }
                }
            }
        }

        if (x.empty() || y.empty() || z.empty())
            throw std::runtime_error("Did not find any atoms inside limits");

        // resize back down to our valid entries
        A.resize(it);
        x.resize(it);
        y.resize(it);
        z.resize(it);
        occ.resize(it);
        ux.resize(it);
        uy.resize(it);
        uz.resize(it);
    }